

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  ostream *poVar1;
  string local_138;
  undefined1 local_118 [8];
  string path;
  string noConfig;
  string local_c8;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string targetName;
  TargetType param_3_local;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportBuildAndroidMKGenerator *this_local;
  
  targetName.field_2._12_4_ = param_3;
  cmAlphaNum::cmAlphaNum
            (&local_78,
             &(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_c8,target);
  cmAlphaNum::cmAlphaNum(&local_a8,&local_c8);
  cmStrCat<>((string *)local_48,&local_78,&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,(string *)local_48);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := ");
  std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
  cmGeneratorTarget::GetFullPath
            (&local_138,target,(string *)(path.field_2._M_local_buf + 8),RuntimeBinaryArtifact,false
            );
  cmSystemTools::ConvertToOutputPath((string *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  poVar1 = std::operator<<(os,(string *)local_118);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string const noConfig; // FIXME: What config to use here?
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath(noConfig));
  os << path << "\n";
}